

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

_Bool ox_buffer_write(buffer_s *self,char *data,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  char *__dest;
  size_t __n;
  byte unaff_R13B;
  bool bVar6;
  
  bVar5 = false;
  while( true ) {
    uVar4 = self->data_len;
    uVar1 = self->write_pos;
    if (len <= uVar4 - uVar1) break;
    uVar2 = self->read_pos;
    __n = uVar1 - uVar2;
    bVar6 = uVar4 - __n < len;
    bVar3 = !bVar6;
    if (bVar6) goto LAB_0013779f;
    if (uVar2 != 0) {
      if (uVar1 != uVar2) {
        memmove(self->data,self->data + uVar2,__n);
      }
      self->read_pos = 0;
      self->write_pos = __n;
    }
    unaff_R13B = unaff_R13B | bVar5 ^ 1U;
    bVar5 = true;
  }
  if (uVar1 < uVar4) {
    __dest = self->data + uVar1;
  }
  else {
    __dest = (char *)0x0;
  }
  memcpy(__dest,data,len);
  uVar4 = len + self->write_pos;
  bVar3 = true;
  if (uVar4 <= self->data_len) {
    self->write_pos = uVar4;
  }
LAB_0013779f:
  if (bVar5) {
    bVar3 = unaff_R13B;
  }
  return (_Bool)(bVar3 & 1);
}

Assistant:

bool 
ox_buffer_write(struct buffer_s* self, const char* data, size_t len)
{
    bool write_ret = true;

    if(ox_buffer_getwritevalidcount(self) >= len)
    {
        /*  直接写入    */
        memcpy(ox_buffer_getwriteptr(self), data, len);
        ox_buffer_addwritepos(self, len);
    }
    else
    {
        size_t left_len = self->data_len - ox_buffer_getreadvalidcount(self);
        if(left_len >= len)
        {
            ox_buffer_adjustto_head(self);
            ox_buffer_write(self, data, len);
        }
        else
        {
            write_ret = false;
        }
    }

    return write_ret;
}